

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode multi_run_expired(multi_run_ctx *mrc)

{
  Curl_multi *multi;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  CURLMcode CVar7;
  CURLMcode CVar8;
  Curl_tree *pCVar9;
  Curl_easy *d;
  curltime i;
  curltime now;
  curltime i_00;
  Curl_tree *t;
  Curl_tree *local_40;
  curltime *local_38;
  
  multi = mrc->multi;
  local_40 = (Curl_tree *)0x0;
  uVar1 = (mrc->now).tv_sec;
  uVar2 = (mrc->now).tv_usec;
  i.tv_usec = uVar2;
  i.tv_sec = uVar1;
  i._12_4_ = 0;
  pCVar9 = Curl_splaygetbest(i,multi->timetree,&local_40);
  multi->timetree = pCVar9;
  if (local_40 == (Curl_tree *)0x0) {
    CVar7 = CURLM_OK;
  }
  else {
    local_38 = &mrc->now;
    CVar7 = CURLM_OK;
    do {
      d = (Curl_easy *)Curl_splayget(local_40);
      if (d != (Curl_easy *)0x0) {
        uVar3 = (mrc->now).tv_sec;
        uVar4 = (mrc->now).tv_usec;
        now.tv_usec = uVar4;
        now.tv_sec = uVar3;
        now._12_4_ = 0;
        add_next_timeout(now,multi,d);
        if (d == multi->admin) {
          mrc->run_cpool = true;
        }
        else {
          mrc->run_xfers = mrc->run_xfers + 1;
          sigpipe_apply(d,&mrc->pipe_st);
          CVar7 = multi_runsingle(multi,local_38,d);
          if (CVar7 < CURLM_BAD_HANDLE) {
            CVar8 = Curl_multi_ev_assess_xfer(multi,d);
            CVar7 = CURLM_OK;
            if (CVar8 != CURLM_OK) {
              return CVar8;
            }
          }
        }
      }
      uVar5 = (mrc->now).tv_sec;
      uVar6 = (mrc->now).tv_usec;
      i_00.tv_usec = uVar6;
      i_00.tv_sec = uVar5;
      i_00._12_4_ = 0;
      pCVar9 = Curl_splaygetbest(i_00,multi->timetree,&local_40);
      multi->timetree = pCVar9;
    } while (local_40 != (Curl_tree *)0x0);
  }
  return CVar7;
}

Assistant:

static CURLMcode multi_run_expired(struct multi_run_ctx *mrc)
{
  struct Curl_multi *multi = mrc->multi;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t = NULL;
  CURLMcode result = CURLM_OK;

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process (compared to mrc->now) in the splay and 'data' will be
   * re-assigned for every expired handle we deal with.
   */
  while(1) {
    /* Check if there is one (more) expired timer to deal with! This function
       extracts a matching node if there is one */
    multi->timetree = Curl_splaygetbest(mrc->now, multi->timetree, &t);
    if(!t)
      goto out;

    data = Curl_splayget(t); /* assign this for next loop */
    if(!data)
      continue;

    (void)add_next_timeout(mrc->now, multi, data);
    if(data == multi->admin) {
      mrc->run_cpool = TRUE;
      continue;
    }

    mrc->run_xfers++;
    sigpipe_apply(data, &mrc->pipe_st);
    result = multi_runsingle(multi, &mrc->now, data);

    if(CURLM_OK >= result) {
      /* reassess event handling of data */
      result = Curl_multi_ev_assess_xfer(multi, data);
      if(result)
        goto out;
    }
  }

out:
  return result;
}